

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O0

void __thiscall xray_re::xr_custom_object::load(xr_custom_object *this,xr_reader *r)

{
  size_t sVar1;
  xr_obj_motion *this_00;
  uint16_t local_1a;
  xr_reader *pxStack_18;
  uint16_t flag;
  xr_reader *r_local;
  xr_custom_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_int>(r,0xf906,&this->m_flags);
  if (sVar1 == 0) {
    sVar1 = xr_reader::find_chunk(pxStack_18,0xf900);
    if (sVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x2d,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
    }
    this->m_flags = 0;
    local_1a = xr_reader::r_u16(pxStack_18);
    if (local_1a != 0) {
      this->m_flags = this->m_flags | 1;
    }
    local_1a = xr_reader::r_u16(pxStack_18);
    if (local_1a != 0) {
      this->m_flags = this->m_flags | 2;
    }
    xr_reader::r_sz(pxStack_18,&this->m_name);
    xr_reader::debug_find_chunk(pxStack_18);
    sVar1 = xr_reader::r_chunk<unsigned_short>(pxStack_18,0xf902,&local_1a);
    if ((sVar1 != 0) && (local_1a != 0)) {
      this->m_flags = this->m_flags | 4;
    }
  }
  else {
    sVar1 = xr_reader::find_chunk(pxStack_18,0xf907);
    if (sVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x1c,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
    }
    xr_reader::r_sz(pxStack_18,&this->m_name);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,0xf903);
  if (sVar1 != 0) {
    xr_reader::r_fvector3(pxStack_18,&this->m_position);
    xr_reader::r_fvector3(pxStack_18,&this->m_rotation);
    xr_reader::r_fvector3(pxStack_18,&this->m_scale);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,0xf905);
  if (sVar1 != 0) {
    this_00 = (xr_obj_motion *)operator_new(0x70);
    xr_obj_motion::xr_obj_motion(this_00);
    this->m_motion = this_00;
    (*(this->m_motion->super_xr_motion)._vptr_xr_motion[2])(this->m_motion,pxStack_18);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar1 = xr_reader::r_chunk<float>(pxStack_18,0xf908,&this->m_time);
  if ((sVar1 != 0) && (this->m_motion == (xr_obj_motion *)0x0)) {
    __assert_fail("m_motion",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                  ,0x3b,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
  }
  return;
}

Assistant:

void xr_custom_object::load(xr_reader& r)
{
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_FLAGS, m_flags)) {
		if (!r.find_chunk(CUSTOMOBJECT_CHUNK_NAME))
			xr_not_expected();
		r.r_sz(m_name);
		r.debug_find_chunk();
	} else if (r.find_chunk(CUSTOMOBJECT_CHUNK_PARAMS)) {
		m_flags = 0;
		uint16_t flag = r.r_u16();
		if (flag)
			m_flags |= COF_SELECTED;
		flag = r.r_u16();
		if (flag)
			m_flags |= COF_VISIBLE;
		r.r_sz(m_name);
		r.debug_find_chunk();

		if (r.r_chunk(CUSTOMOBJECT_CHUNK_f902, flag) && flag)
			m_flags |= COF_LOCKED;
	} else {
		xr_not_expected();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_XFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.r_fvector3(m_scale);
		r.debug_find_chunk();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_MOTION)) {
		m_motion = new xr_obj_motion();
		m_motion->load(r);
		r.debug_find_chunk();
	}
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_TIME, m_time)) {
		xr_assert(m_motion);
	}
}